

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool __thiscall ON_BinaryArchive::BeginRead3dmLayerTable(ON_BinaryArchive *this)

{
  bool bVar1;
  
  this->m_3dm_v1_layer_index = 0;
  bVar1 = BeginRead3dmTable(this,0x10000011);
  if ((bVar1) && (this->m_3dm_version == 1)) {
    Seek3dmChunkFromStart(this,0x400010);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool ON_BinaryArchive::BeginRead3dmLayerTable()
{
  m_3dm_v1_layer_index = 0;
  bool rc = BeginRead3dmTable( TCODE_LAYER_TABLE );
  if ( rc && m_3dm_version == 1 )
  {
    rc = Seek3dmChunkFromStart( TCODE_LAYER );
    rc = true; // there are 1.0 files written by the old IO toolkit that have no layers
  }
  return rc;
}